

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

saint_t ss_compare(sauchar_t *T,saidx_t *p1,saidx_t *p2,saidx_t depth)

{
  sauchar_t *psVar1;
  bool bVar2;
  int local_4c;
  int local_48;
  sauchar_t *U2n;
  sauchar_t *U1n;
  sauchar_t *U2;
  sauchar_t *U1;
  saidx_t depth_local;
  saidx_t *p2_local;
  saidx_t *p1_local;
  sauchar_t *T_local;
  
  U1 = T + (long)*p1 + (long)depth;
  U2 = T + (long)*p2 + (long)depth;
  psVar1 = T + (long)p2[1] + 2;
  while( true ) {
    bVar2 = false;
    if ((U1 < T + (long)p1[1] + 2) && (bVar2 = false, U2 < psVar1)) {
      bVar2 = *U1 == *U2;
    }
    if (!bVar2) break;
    U1 = U1 + 1;
    U2 = U2 + 1;
  }
  if (U1 < T + (long)p1[1] + 2) {
    if (U2 < psVar1) {
      local_48 = (uint)*U1 - (uint)*U2;
    }
    else {
      local_48 = 1;
    }
    local_4c = local_48;
  }
  else {
    local_4c = 0;
    if (U2 < psVar1) {
      local_4c = -1;
    }
  }
  return local_4c;
}

Assistant:

static INLINE
saint_t
ss_compare(const sauchar_t *T,
           const saidx_t *p1, const saidx_t *p2,
           saidx_t depth) {
  const sauchar_t *U1, *U2, *U1n, *U2n;

  for(U1 = T + depth + *p1,
      U2 = T + depth + *p2,
      U1n = T + *(p1 + 1) + 2,
      U2n = T + *(p2 + 1) + 2;
      (U1 < U1n) && (U2 < U2n) && (*U1 == *U2);
      ++U1, ++U2) {
  }

  return U1 < U1n ?
        (U2 < U2n ? *U1 - *U2 : 1) :
        (U2 < U2n ? -1 : 0);
}